

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrixfree_gmres.cpp
# Opt level: O0

void __thiscall MatrixFreeGMRES::MatrixFreeGMRES(MatrixFreeGMRES *this,int dim_equation,int k)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDI;
  Index *size;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffffc0;
  Index *this_01;
  Index *rows;
  
  (in_RDI->m_storage).m_data = (double *)&PTR___cxa_pure_virtual_001c4bc0;
  rows = &(in_RDI->m_storage).m_cols;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffffc0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(in_stack_ffffffffffffffc0);
  this_01 = &in_RDI[2].m_storage.m_cols;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this_01);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this_01);
  this_00 = in_RDI + 4;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this_01);
  size = &in_RDI[4].m_storage.m_cols;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this_01);
  *(undefined4 *)&(in_RDI->m_storage).m_rows = in_ESI;
  *(undefined4 *)((long)&(in_RDI->m_storage).m_rows + 4) = in_EDX;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (in_RDI,(Index)rows,(Index)this_01);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (in_RDI,(Index)rows,(Index)this_01);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(Index)size);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(Index)size);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(Index)size);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,(Index)size);
  return;
}

Assistant:

MatrixFreeGMRES::MatrixFreeGMRES(const int dim_equation, const int k)
{
    dim_equation_ = dim_equation;
    max_dim_krylov_ = k;

    // Allocate matrices and vectors for matrix-free GMRES.
    hessenberg_mat_.resize(max_dim_krylov_+1, max_dim_krylov_+1);
    basis_mat_.resize(dim_equation_, max_dim_krylov_+1);
    b_vec_.resize(dim_equation_);
    givens_c_vec_.resize(max_dim_krylov_+1);
    givens_s_vec_.resize(max_dim_krylov_+1);
    g_vec_.resize(max_dim_krylov_+1);
}